

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O0

UBool __thiscall icu_63::MessagePattern::operator==(MessagePattern *this,MessagePattern *other)

{
  UBool UVar1;
  bool local_2a;
  bool local_29;
  MessagePattern *other_local;
  MessagePattern *this_local;
  
  if (this == other) {
    this_local._7_1_ = true;
  }
  else {
    local_29 = false;
    if (this->aposMode == other->aposMode) {
      UVar1 = UnicodeString::operator==(&this->msg,&other->msg);
      local_29 = false;
      if ((UVar1 != '\0') && (local_29 = false, this->partsLength == other->partsLength)) {
        local_2a = true;
        if (this->partsLength != 0) {
          UVar1 = MessagePatternList<icu_63::MessagePattern::Part,_32>::equals
                            (&this->partsList->
                              super_MessagePatternList<icu_63::MessagePattern::Part,_32>,
                             &other->partsList->
                              super_MessagePatternList<icu_63::MessagePattern::Part,_32>,
                             this->partsLength);
          local_2a = UVar1 != '\0';
        }
        local_29 = local_2a;
      }
    }
    this_local._7_1_ = local_29;
  }
  return this_local._7_1_;
}

Assistant:

UBool
MessagePattern::operator==(const MessagePattern &other) const {
    if(this==&other) {
        return TRUE;
    }
    return
        aposMode==other.aposMode &&
        msg==other.msg &&
        // parts.equals(o.parts)
        partsLength==other.partsLength &&
        (partsLength==0 || partsList->equals(*other.partsList, partsLength));
    // No need to compare numericValues if msg and parts are the same.
}